

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

void FastPForLib::Simple16<false>::unpack3_1_4_4_3_3(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 >> 0x19 & 7;
  puVar2[1] = *puVar1 >> 0x15 & 0xf;
  puVar2[2] = *puVar1 >> 0x11 & 0xf;
  puVar2[3] = *puVar1 >> 0xd & 0xf;
  puVar2[4] = *puVar1 >> 9 & 0xf;
  puVar2[5] = *puVar1 >> 6 & 7;
  puVar2[6] = *puVar1 >> 3 & 7;
  puVar2[7] = *puVar1 & 7;
  *in = puVar1 + 1;
  *out = puVar2 + 8;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack3_1_4_4_3_3(uint32_t **out,
                                             const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 25) & 0x07;

  pout[1] = (pin[0] >> 21) & 0x0f;
  pout[2] = (pin[0] >> 17) & 0x0f;
  pout[3] = (pin[0] >> 13) & 0x0f;
  pout[4] = (pin[0] >> 9) & 0x0f;

  pout[5] = (pin[0] >> 6) & 0x07;
  pout[6] = (pin[0] >> 3) & 0x07;
  pout[7] = pin[0] & 0x07;

  *in = pin + 1;
  *out = pout + 8;
}